

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlListCopy(void)

{
  int iVar1;
  int iVar2;
  xmlListPtr val;
  xmlListPtr val_00;
  int local_34;
  int n_old;
  xmlListPtr old;
  int n_cur;
  xmlListPtr cur;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (old._4_4_ = 0; (int)old._4_4_ < 2; old._4_4_ = old._4_4_ + 1) {
    for (local_34 = 0; local_34 < 1; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlListPtr(old._4_4_,0);
      val_00 = gen_const_xmlListPtr(local_34,1);
      iVar2 = xmlListCopy(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlListPtr(old._4_4_,val,0);
      des_const_xmlListPtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListCopy",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)old._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlListCopy(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlListPtr cur; /* the new list */
    int n_cur;
    xmlListPtr old; /* the old list */
    int n_old;

    for (n_cur = 0;n_cur < gen_nb_xmlListPtr;n_cur++) {
    for (n_old = 0;n_old < gen_nb_const_xmlListPtr;n_old++) {
        mem_base = xmlMemBlocks();
        cur = gen_xmlListPtr(n_cur, 0);
        old = gen_const_xmlListPtr(n_old, 1);

        ret_val = xmlListCopy(cur, (const xmlListPtr)old);
        desret_int(ret_val);
        call_tests++;
        des_xmlListPtr(n_cur, cur, 0);
        des_const_xmlListPtr(n_old, (const xmlListPtr)old, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlListCopy",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_old);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}